

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O2

FT_Error skip_literal_string(FT_Byte **acur,FT_Byte *limit)

{
  byte bVar1;
  FT_Error FVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  long lVar6;
  uint uVar7;
  
  iVar3 = 0;
  FVar2 = 3;
  pbVar5 = *acur;
  do {
    while( true ) {
      while( true ) {
        pbVar4 = pbVar5;
        if (limit <= pbVar5) goto LAB_00207f86;
        bVar1 = *pbVar5;
        pbVar4 = pbVar5 + 1;
        if (bVar1 != 0x5c) break;
        if (pbVar4 == limit) goto LAB_00207f86;
        uVar7 = *pbVar4 - 0x5c;
        if (((uVar7 < 0x19) && ((0x1440441U >> (uVar7 & 0x1f) & 1) != 0)) || (*pbVar4 - 0x28 < 2)) {
          pbVar5 = pbVar5 + 2;
        }
        else {
          for (lVar6 = 0;
              ((pbVar5 = pbVar4 + lVar6, (uint)lVar6 < 3 && (pbVar5 < limit)) &&
              ((*pbVar5 & 0xf8) == 0x30)); lVar6 = lVar6 + 1) {
          }
        }
      }
      pbVar5 = pbVar4;
      if (bVar1 != 0x28) break;
      iVar3 = iVar3 + 1;
    }
  } while ((bVar1 != 0x29) || (iVar3 = iVar3 + -1, iVar3 != 0));
  FVar2 = 0;
LAB_00207f86:
  *acur = pbVar4;
  return FVar2;
}

Assistant:

static FT_Error
  skip_literal_string( FT_Byte*  *acur,
                       FT_Byte*   limit )
  {
    FT_Byte*      cur   = *acur;
    FT_Int        embed = 0;
    FT_Error      error = FT_ERR( Invalid_File_Format );
    unsigned int  i;


    while ( cur < limit )
    {
      FT_Byte  c = *cur;


      cur++;

      if ( c == '\\' )
      {
        /* Red Book 3rd ed., section `Literal Text Strings', p. 29:     */
        /* A backslash can introduce three different types              */
        /* of escape sequences:                                         */
        /*   - a special escaped char like \r, \n, etc.                 */
        /*   - a one-, two-, or three-digit octal number                */
        /*   - none of the above in which case the backslash is ignored */

        if ( cur == limit )
          /* error (or to be ignored?) */
          break;

        switch ( *cur )
        {
          /* skip `special' escape */
        case 'n':
        case 'r':
        case 't':
        case 'b':
        case 'f':
        case '\\':
        case '(':
        case ')':
          cur++;
          break;

        default:
          /* skip octal escape or ignore backslash */
          for ( i = 0; i < 3 && cur < limit; i++ )
          {
            if ( !IS_OCTAL_DIGIT( *cur ) )
              break;

            cur++;
          }
        }
      }
      else if ( c == '(' )
        embed++;
      else if ( c == ')' )
      {
        embed--;
        if ( embed == 0 )
        {
          error = FT_Err_Ok;
          break;
        }
      }
    }

    *acur = cur;

    return error;
  }